

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::validate_iterator(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                    *this,const_iterator *it)

{
  memory_resource *pmVar1;
  polymorphic_allocator<char> local_20;
  
  if ((this->buffer_).v2_.last == (pointer_type)0x0) {
    end((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
         *)&local_20);
    if (local_20._M_resource != (memory_resource *)it->p_) goto LAB_00107dd9;
  }
  else {
    end((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
         *)&local_20);
    pmVar1 = (memory_resource *)it->p_;
    if ((local_20._M_resource != pmVar1) &&
       ((pmVar1 < (memory_resource *)(this->buffer_).v2_.begin ||
        ((memory_resource *)(this->buffer_).v2_.last < pmVar1)))) {
LAB_00107dd9:
      std::terminate();
    }
    validate_compare_to_all_valid_elements(this,it);
  }
  return;
}

Assistant:

void validate_iterator(const_iterator const &it) const noexcept {
        //
        // If we do not have any valid elements then
        // only end iterator is valid.
        // Otherwise iterator should be an end or point somewhere
        // between begin of the buffer and start of the first element
        //
        if (empty_unsafe()) {
            FFL_CODDING_ERROR_IF_NOT(cend() == it);
        } else {
            FFL_CODDING_ERROR_IF_NOT(cend() == it ||
                                     (buff().begin <= it.get_ptr() && it.get_ptr() <= buff().last));
            validate_compare_to_all_valid_elements(it);
        }
    }